

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallSubdirectoryGenerator::GenerateScript(cmInstallSubdirectoryGenerator *this,ostream *os)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  allocator<char> local_41;
  string odir;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>((string *)&odir,"EXCLUDE_FROM_ALL",&local_41);
  bVar1 = cmMakefile::GetPropertyAsBool(this_00,&odir);
  std::__cxx11::string::~string((string *)&odir);
  if (!bVar1) {
    PVar2 = cmLocalGenerator::GetPolicyStatus(this->LocalGenerator,CMP0082);
    if (PVar2 - NEW < 3) {
      std::__cxx11::string::string((string *)&odir,(string *)&this->BinaryDirectory);
      cmsys::SystemTools::ConvertToUnixSlashes(&odir);
      poVar3 = ::operator<<(os,(cmScriptGeneratorIndent)0x0);
      poVar3 = std::operator<<(poVar3,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n");
      poVar3 = ::operator<<(poVar3,(cmScriptGeneratorIndent)0x2);
      poVar3 = std::operator<<(poVar3,"# Include the install script for the subdirectory.\n");
      poVar3 = ::operator<<(poVar3,(cmScriptGeneratorIndent)0x2);
      poVar3 = std::operator<<(poVar3,"include(\"");
      poVar3 = std::operator<<(poVar3,(string *)&odir);
      poVar3 = std::operator<<(poVar3,"/cmake_install.cmake\")\n");
      poVar3 = ::operator<<(poVar3,(cmScriptGeneratorIndent)0x0);
      std::operator<<(poVar3,"endif()\n\n");
      std::__cxx11::string::~string((string *)&odir);
    }
  }
  return;
}

Assistant:

void cmInstallSubdirectoryGenerator::GenerateScript(std::ostream& os)
{
  if (!this->Makefile->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    cmPolicies::PolicyStatus status =
      this->LocalGenerator->GetPolicyStatus(cmPolicies::CMP0082);
    switch (status) {
      case cmPolicies::WARN:
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is handled in cmLocalGenerator::GenerateInstallRules()
        break;

      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS: {
        Indent indent;
        std::string odir = this->BinaryDirectory;
        cmSystemTools::ConvertToUnixSlashes(odir);
        os << indent << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n"
           << indent.Next()
           << "# Include the install script for the subdirectory.\n"
           << indent.Next() << "include(\"" << odir
           << "/cmake_install.cmake\")\n"
           << indent << "endif()\n\n";
      } break;
    }
  }
}